

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeDecoder::DecodeValues
          (SequentialAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  pointer pIVar1;
  pointer pIVar2;
  int iVar3;
  int iVar4;
  void *__dest;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong __n;
  long lVar8;
  int iVar9;
  
  pIVar1 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar2 = (point_ids->
           super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (ulong)(int)(this->attribute_->super_GeometryAttribute).byte_stride_;
  __dest = operator_new__(__n);
  iVar9 = (int)((ulong)((long)pIVar1 - (long)pIVar2) >> 2);
  bVar5 = iVar9 < 1;
  if (0 < iVar9) {
    lVar7 = in_buffer->pos_;
    lVar8 = lVar7 + __n;
    if (lVar8 <= in_buffer->data_size_) {
      lVar6 = 0;
      iVar3 = 1;
      do {
        iVar4 = iVar3;
        memcpy(__dest,in_buffer->data_ + lVar7,__n);
        in_buffer->pos_ = lVar8;
        memcpy((void *)(*(long *)&(((this->attribute_->attribute_buffer_)._M_t.
                                    super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                    .super__Head_base<0UL,_draco::DataBuffer_*,_false>._M_head_impl)
                                  ->data_).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       + lVar6),__dest,__n);
        if (iVar9 == iVar4) break;
        lVar6 = lVar6 + __n;
        lVar7 = in_buffer->pos_;
        lVar8 = lVar7 + __n;
        iVar3 = iVar4 + 1;
      } while (lVar8 <= in_buffer->data_size_);
      bVar5 = iVar9 <= iVar4;
    }
  }
  operator_delete__(__dest);
  return bVar5;
}

Assistant:

bool SequentialAttributeDecoder::DecodeValues(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  const int32_t num_values = static_cast<uint32_t>(point_ids.size());
  const int entry_size = static_cast<int>(attribute_->byte_stride());
  std::unique_ptr<uint8_t[]> value_data_ptr(new uint8_t[entry_size]);
  uint8_t *const value_data = value_data_ptr.get();
  int out_byte_pos = 0;
  // Decode raw attribute values in their original format.
  for (int i = 0; i < num_values; ++i) {
    if (!in_buffer->Decode(value_data, entry_size)) {
      return false;
    }
    attribute_->buffer()->Write(out_byte_pos, value_data, entry_size);
    out_byte_pos += entry_size;
  }
  return true;
}